

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superfamiconv.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  char **argv_local;
  int argc_local;
  
  if ((1 < argc) && (iVar1 = strcmp(argv[1],"palette"), iVar1 == 0)) {
    strcpy(argv[1],"");
    iVar1 = sfc_palette(argc,argv);
    return iVar1;
  }
  if ((1 < argc) && (iVar1 = strcmp(argv[1],"tiles"), iVar1 == 0)) {
    strcpy(argv[1],"");
    iVar1 = sfc_tiles(argc,argv);
    return iVar1;
  }
  if ((1 < argc) && (iVar1 = strcmp(argv[1],"map"), iVar1 == 0)) {
    strcpy(argv[1],"");
    iVar1 = sfc_map(argc,argv);
    return iVar1;
  }
  iVar1 = superfamiconv(argc,argv);
  return iVar1;
}

Assistant:

int main(int argc, char* argv[]) {
  // If first argument is a subcommand, remove it and pass along
  if (argc > 1 && std::strcmp(argv[1], "palette") == 0) {
    std::strcpy(argv[1], "");
    return sfc_palette(argc, argv);

  } else if (argc > 1 && std::strcmp(argv[1], "tiles") == 0) {
    std::strcpy(argv[1], "");
    return sfc_tiles(argc, argv);

  } else if (argc > 1 && std::strcmp(argv[1], "map") == 0) {
    std::strcpy(argv[1], "");
    return sfc_map(argc, argv);

  } else {
    return superfamiconv(argc, argv);
  }
}